

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glwInitFunctions.cpp
# Opt level: O2

void glw::initES30(Functions *gl,FunctionLoader *loader)

{
  undefined8 uVar1;
  
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glActiveTexture");
  *(undefined8 *)(gl + 8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glAttachShader");
  *(undefined8 *)(gl + 0x10) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBeginQuery");
  *(undefined8 *)(gl + 0x20) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBeginTransformFeedback");
  *(undefined8 *)(gl + 0x30) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindAttribLocation");
  *(undefined8 *)(gl + 0x38) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindBuffer");
  *(undefined8 *)(gl + 0x40) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindBufferBase");
  *(undefined8 *)(gl + 0x48) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindBufferRange");
  *(undefined8 *)(gl + 0x50) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindFramebuffer");
  *(undefined8 *)(gl + 0x78) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindRenderbuffer");
  *(undefined8 *)(gl + 0xa0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindSampler");
  *(undefined8 *)(gl + 0xa8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindTexture");
  *(undefined8 *)(gl + 0xb8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindTransformFeedback");
  *(undefined8 *)(gl + 0xd0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindVertexArray");
  *(undefined8 *)(gl + 0xd8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBlendColor");
  *(undefined8 *)(gl + 0xf8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBlendEquation");
  *(undefined8 *)(gl + 0x100) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBlendEquationSeparate");
  *(undefined8 *)(gl + 0x108) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBlendFunc");
  *(undefined8 *)(gl + 0x120) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBlendFuncSeparate");
  *(undefined8 *)(gl + 0x128) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBlitFramebuffer");
  *(undefined8 *)(gl + 0x140) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBufferData");
  *(undefined8 *)(gl + 0x150) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBufferSubData");
  *(undefined8 *)(gl + 0x168) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCheckFramebufferStatus");
  *(undefined8 *)(gl + 0x170) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glClear");
  *(undefined8 *)(gl + 0x188) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glClearBufferfi");
  *(undefined8 *)(gl + 0x1a0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glClearBufferfv");
  *(undefined8 *)(gl + 0x1a8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glClearBufferiv");
  *(undefined8 *)(gl + 0x1b0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glClearBufferuiv");
  *(undefined8 *)(gl + 0x1b8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glClearColor");
  *(undefined8 *)(gl + 0x1c0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glClearDepthf");
  *(undefined8 *)(gl + 0x1d0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glClearStencil");
  *(undefined8 *)(gl + 0x208) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glClientWaitSync");
  *(undefined8 *)(gl + 0x228) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glColorMask");
  *(undefined8 *)(gl + 0x238) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCompileShader");
  *(undefined8 *)(gl + 0x248) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCompressedTexImage2D");
  *(undefined8 *)(gl + 0x288) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCompressedTexImage3D");
  *(undefined8 *)(gl + 0x290) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCompressedTexSubImage2D");
  *(undefined8 *)(gl + 0x2a8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCompressedTexSubImage3D");
  *(undefined8 *)(gl + 0x2b0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCopyBufferSubData");
  *(undefined8 *)(gl + 0x308) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCopyTexImage2D");
  *(undefined8 *)(gl + 0x350) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCopyTexSubImage2D");
  *(undefined8 *)(gl + 0x360) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCopyTexSubImage3D");
  *(undefined8 *)(gl + 0x368) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCreateProgram");
  *(undefined8 *)(gl + 0x3c8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCreateShader");
  *(undefined8 *)(gl + 0x3f0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCullFace");
  *(undefined8 *)(gl + 0x418) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteBuffers");
  *(undefined8 *)(gl + 0x438) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteFramebuffers");
  *(undefined8 *)(gl + 0x440) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteProgram");
  *(undefined8 *)(gl + 0x448) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteQueries");
  *(undefined8 *)(gl + 0x458) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteRenderbuffers");
  *(undefined8 *)(gl + 0x460) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteSamplers");
  *(undefined8 *)(gl + 0x468) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteShader");
  *(undefined8 *)(gl + 0x470) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteSync");
  *(undefined8 *)(gl + 0x478) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteTextures");
  *(undefined8 *)(gl + 0x480) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteTransformFeedbacks");
  *(undefined8 *)(gl + 0x488) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteVertexArrays");
  *(undefined8 *)(gl + 0x490) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDepthFunc");
  *(undefined8 *)(gl + 0x4a0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDepthMask");
  *(undefined8 *)(gl + 0x4a8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDepthRangef");
  *(undefined8 *)(gl + 0x4d8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDetachShader");
  *(undefined8 *)(gl + 0x4e0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDisable");
  *(undefined8 *)(gl + 0x4e8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDisableVertexAttribArray");
  *(undefined8 *)(gl + 0x518) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDrawArrays");
  *(undefined8 *)(gl + 0x538) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDrawArraysInstanced");
  *(undefined8 *)(gl + 0x548) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDrawBuffers");
  *(undefined8 *)(gl + 0x560) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDrawElements");
  *(undefined8 *)(gl + 0x568) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDrawElementsInstanced");
  *(undefined8 *)(gl + 0x580) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDrawRangeElements");
  *(undefined8 *)(gl + 0x5a0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glEnable");
  *(undefined8 *)(gl + 0x5e0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glEnableVertexAttribArray");
  *(undefined8 *)(gl + 0x610) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glEndQuery");
  *(undefined8 *)(gl + 0x628) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glEndTransformFeedback");
  *(undefined8 *)(gl + 0x638) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glFenceSync");
  *(undefined8 *)(gl + 0x640) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glFinish");
  *(undefined8 *)(gl + 0x648) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glFlush");
  *(undefined8 *)(gl + 0x650) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glFlushMappedBufferRange");
  *(undefined8 *)(gl + 0x658) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glFramebufferRenderbuffer");
  *(undefined8 *)(gl + 0x688) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glFramebufferTexture2D");
  *(undefined8 *)(gl + 0x6a0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glFramebufferTextureLayer");
  *(undefined8 *)(gl + 0x6b8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glFrontFace");
  *(undefined8 *)(gl + 0x6c0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGenBuffers");
  *(undefined8 *)(gl + 0x6c8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGenFramebuffers");
  *(undefined8 *)(gl + 0x6d0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGenQueries");
  *(undefined8 *)(gl + 0x6e0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGenRenderbuffers");
  *(undefined8 *)(gl + 0x6e8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGenSamplers");
  *(undefined8 *)(gl + 0x6f0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGenTextures");
  *(undefined8 *)(gl + 0x6f8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGenTransformFeedbacks");
  *(undefined8 *)(gl + 0x700) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGenVertexArrays");
  *(undefined8 *)(gl + 0x708) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGenerateMipmap");
  *(undefined8 *)(gl + 0x710) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetActiveAttrib");
  *(undefined8 *)(gl + 0x730) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetActiveUniform");
  *(undefined8 *)(gl + 0x750) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetActiveUniformBlockName");
  *(undefined8 *)(gl + 0x758) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetActiveUniformBlockiv");
  *(undefined8 *)(gl + 0x760) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetActiveUniformsiv");
  *(undefined8 *)(gl + 0x770) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetAttachedShaders");
  *(undefined8 *)(gl + 0x778) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetAttribLocation");
  *(undefined8 *)(gl + 0x780) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetBooleanv");
  *(undefined8 *)(gl + 0x798) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetBufferParameteri64v");
  *(undefined8 *)(gl + 0x7a0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetBufferParameteriv");
  *(undefined8 *)(gl + 0x7a8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetBufferPointerv");
  *(undefined8 *)(gl + 0x7b0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetError");
  *(undefined8 *)(gl + 0x800) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetFloatv");
  *(undefined8 *)(gl + 0x818) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetFragDataLocation");
  *(undefined8 *)(gl + 0x828) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetFramebufferAttachmentParameteriv");
  *(undefined8 *)(gl + 0x830) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetInteger64i_v");
  *(undefined8 *)(gl + 0x848) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetInteger64v");
  *(undefined8 *)(gl + 0x850) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetIntegeri_v");
  *(undefined8 *)(gl + 0x860) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetIntegerv");
  *(undefined8 *)(gl + 0x868) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetInternalformativ");
  *(undefined8 *)(gl + 0x880) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetProgramBinary");
  *(undefined8 *)(gl + 0x980) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetProgramInfoLog");
  *(undefined8 *)(gl + 0x988) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetProgramiv");
  *(undefined8 *)(gl + 0x9d8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetQueryObjectuiv");
  *(undefined8 *)(gl + 0xa20) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetQueryiv");
  *(undefined8 *)(gl + 0xa28) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetRenderbufferParameteriv");
  *(undefined8 *)(gl + 0xa30) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetSamplerParameterfv");
  *(undefined8 *)(gl + 0xa48) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetSamplerParameteriv");
  *(undefined8 *)(gl + 0xa50) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetShaderInfoLog");
  *(undefined8 *)(gl + 0xa58) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetShaderPrecisionFormat");
  *(undefined8 *)(gl + 0xa60) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetShaderSource");
  *(undefined8 *)(gl + 0xa68) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetShaderiv");
  *(undefined8 *)(gl + 0xa70) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetString");
  *(undefined8 *)(gl + 0xa78) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetStringi");
  *(undefined8 *)(gl + 0xa80) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetSynciv");
  *(undefined8 *)(gl + 0xa98) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetTexParameterfv");
  *(undefined8 *)(gl + 0xac8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetTexParameteriv");
  *(undefined8 *)(gl + 0xad0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetTransformFeedbackVarying");
  *(undefined8 *)(gl + 0xb18) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetUniformBlockIndex");
  *(undefined8 *)(gl + 0xb38) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetUniformIndices");
  *(undefined8 *)(gl + 0xb40) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetUniformLocation");
  *(undefined8 *)(gl + 0xb48) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetUniformfv");
  *(undefined8 *)(gl + 0xb60) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetUniformiv");
  *(undefined8 *)(gl + 0xb68) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetUniformuiv");
  *(undefined8 *)(gl + 0xb70) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetVertexAttribIiv");
  *(undefined8 *)(gl + 0xbb0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetVertexAttribIuiv");
  *(undefined8 *)(gl + 3000) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetVertexAttribPointerv");
  *(undefined8 *)(gl + 0xbc8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetVertexAttribfv");
  *(undefined8 *)(gl + 0xbd8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetVertexAttribiv");
  *(undefined8 *)(gl + 0xbe0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glHint");
  *(undefined8 *)(gl + 0xc18) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glInvalidateFramebuffer");
  *(undefined8 *)(gl + 0xc38) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glInvalidateSubFramebuffer");
  *(undefined8 *)(gl + 0xc50) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsBuffer");
  *(undefined8 *)(gl + 0xc68) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsEnabled");
  *(undefined8 *)(gl + 0xc70) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsFramebuffer");
  *(undefined8 *)(gl + 0xc88) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsProgram");
  *(undefined8 *)(gl + 0xc90) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsQuery");
  *(undefined8 *)(gl + 0xca0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsRenderbuffer");
  *(undefined8 *)(gl + 0xca8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsSampler");
  *(undefined8 *)(gl + 0xcb0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsShader");
  *(undefined8 *)(gl + 0xcb8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsSync");
  *(undefined8 *)(gl + 0xcc0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsTexture");
  *(undefined8 *)(gl + 0xcc8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsTransformFeedback");
  *(undefined8 *)(gl + 0xcd0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsVertexArray");
  *(undefined8 *)(gl + 0xcd8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glLineWidth");
  *(undefined8 *)(gl + 0xce0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glLinkProgram");
  *(undefined8 *)(gl + 0xce8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glMapBufferRange");
  *(undefined8 *)(gl + 0xd00) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glPauseTransformFeedback");
  *(undefined8 *)(gl + 0xfe0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glPixelStorei");
  *(undefined8 *)(gl + 0xff0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glPolygonOffset");
  *(undefined8 *)(gl + 0x1028) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glProgramBinary");
  *(undefined8 *)(gl + 0x1050) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glProgramParameteri");
  *(undefined8 *)(gl + 0x1058) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glReadBuffer");
  *(undefined8 *)(gl + 0x1218) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glReadPixels");
  *(undefined8 *)(gl + 0x1220) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glReleaseShaderCompiler");
  *(undefined8 *)(gl + 0x1230) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glRenderbufferStorage");
  *(undefined8 *)(gl + 0x1238) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glRenderbufferStorageMultisample");
  *(undefined8 *)(gl + 0x1240) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glResumeTransformFeedback");
  *(undefined8 *)(gl + 0x1248) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glSampleCoverage");
  *(undefined8 *)(gl + 0x1250) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glSamplerParameterf");
  *(undefined8 *)(gl + 0x1270) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glSamplerParameterfv");
  *(undefined8 *)(gl + 0x1278) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glSamplerParameteri");
  *(undefined8 *)(gl + 0x1280) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glSamplerParameteriv");
  *(undefined8 *)(gl + 0x1288) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glScissor");
  *(undefined8 *)(gl + 0x1290) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glShaderBinary");
  *(undefined8 *)(gl + 0x12b0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glShaderSource");
  *(undefined8 *)(gl + 0x12b8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glStencilFunc");
  *(undefined8 *)(gl + 0x12c8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glStencilFuncSeparate");
  *(undefined8 *)(gl + 0x12d0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glStencilMask");
  *(undefined8 *)(gl + 0x12d8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glStencilMaskSeparate");
  *(undefined8 *)(gl + 0x12e0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glStencilOp");
  *(undefined8 *)(gl + 0x12e8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glStencilOpSeparate");
  *(undefined8 *)(gl + 0x12f0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexImage2D");
  *(undefined8 *)(gl + 0x1310) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexImage3D");
  *(undefined8 *)(gl + 0x1320) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexParameterf");
  *(undefined8 *)(gl + 0x1350) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexParameterfv");
  *(undefined8 *)(gl + 0x1358) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexParameteri");
  *(undefined8 *)(gl + 0x1360) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexParameteriv");
  *(undefined8 *)(gl + 0x1368) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexStorage2D");
  *(undefined8 *)(gl + 0x1380) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexStorage3D");
  *(undefined8 *)(gl + 0x1398) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexSubImage2D");
  *(undefined8 *)(gl + 0x13b8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexSubImage3D");
  *(undefined8 *)(gl + 0x13c0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTransformFeedbackVaryings");
  *(undefined8 *)(gl + 0x14c8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform1f");
  *(undefined8 *)(gl + 0x14e0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform1fv");
  *(undefined8 *)(gl + 0x14e8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform1i");
  *(undefined8 *)(gl + 0x14f0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform1iv");
  *(undefined8 *)(gl + 0x14f8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform1ui");
  *(undefined8 *)(gl + 0x1500) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform1uiv");
  *(undefined8 *)(gl + 0x1508) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform2f");
  *(undefined8 *)(gl + 0x1520) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform2fv");
  *(undefined8 *)(gl + 0x1528) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform2i");
  *(undefined8 *)(gl + 0x1530) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform2iv");
  *(undefined8 *)(gl + 0x1538) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform2ui");
  *(undefined8 *)(gl + 0x1540) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform2uiv");
  *(undefined8 *)(gl + 0x1548) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform3f");
  *(undefined8 *)(gl + 0x1560) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform3fv");
  *(undefined8 *)(gl + 0x1568) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform3i");
  *(undefined8 *)(gl + 0x1570) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform3iv");
  *(undefined8 *)(gl + 0x1578) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform3ui");
  *(undefined8 *)(gl + 0x1580) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform3uiv");
  *(undefined8 *)(gl + 0x1588) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform4f");
  *(undefined8 *)(gl + 0x15a0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform4fv");
  *(undefined8 *)(gl + 0x15a8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform4i");
  *(undefined8 *)(gl + 0x15b0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform4iv");
  *(undefined8 *)(gl + 0x15b8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform4ui");
  *(undefined8 *)(gl + 0x15c0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform4uiv");
  *(undefined8 *)(gl + 0x15c8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformBlockBinding");
  *(undefined8 *)(gl + 0x15d0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformMatrix2fv");
  *(undefined8 *)(gl + 0x15e0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformMatrix2x3fv");
  *(undefined8 *)(gl + 0x15f0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformMatrix2x4fv");
  *(undefined8 *)(gl + 0x1600) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformMatrix3fv");
  *(undefined8 *)(gl + 0x1610) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformMatrix3x2fv");
  *(undefined8 *)(gl + 0x1620) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformMatrix3x4fv");
  *(undefined8 *)(gl + 0x1630) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformMatrix4fv");
  *(undefined8 *)(gl + 0x1640) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformMatrix4x2fv");
  *(undefined8 *)(gl + 0x1650) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformMatrix4x3fv");
  *(undefined8 *)(gl + 0x1660) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUnmapBuffer");
  *(undefined8 *)(gl + 0x1670) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUseProgram");
  *(undefined8 *)(gl + 0x1680) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glValidateProgram");
  *(undefined8 *)(gl + 0x1690) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib1f");
  *(undefined8 *)(gl + 0x1788) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib1fv");
  *(undefined8 *)(gl + 0x1790) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib2f");
  *(undefined8 *)(gl + 0x17b8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib2fv");
  *(undefined8 *)(gl + 0x17c0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib3f");
  *(undefined8 *)(gl + 0x17e8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib3fv");
  *(undefined8 *)(gl + 0x17f0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4f");
  *(undefined8 *)(gl + 0x1858) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4fv");
  *(undefined8 *)(gl + 0x1860) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribDivisor");
  *(undefined8 *)(gl + 0x18a0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI4i");
  *(undefined8 *)(gl + 0x1918) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI4iv");
  *(undefined8 *)(gl + 0x1920) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI4ui");
  *(undefined8 *)(gl + 0x1938) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI4uiv");
  *(undefined8 *)(gl + 0x1940) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribIPointer");
  *(undefined8 *)(gl + 0x1958) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribPointer");
  *(undefined8 *)(gl + 0x19f0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glViewport");
  *(undefined8 *)(gl + 0x1a00) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glWaitSync");
  *(undefined8 *)(gl + 0x1a20) = uVar1;
  return;
}

Assistant:

void initES30 (Functions* gl, const FunctionLoader* loader)
{
#include "glwInitES30.inl"
}